

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

void __thiscall inja::Parser::parse_into_template(Parser *this,Template *tmpl,path *filename)

{
  Parser sub_parser;
  path pStack_1c8;
  Parser local_1a0;
  
  Parser(&local_1a0,this->config,(this->lexer).config,this->template_storage,this->function_storage)
  ;
  ::std::filesystem::__cxx11::path::parent_path();
  parse_into(&local_1a0,tmpl,&pStack_1c8);
  std::filesystem::__cxx11::path::~path(&pStack_1c8);
  std::_Deque_base<inja::BlockStatementNode_*,_std::allocator<inja::BlockStatementNode_*>_>::
  ~_Deque_base((_Deque_base<inja::BlockStatementNode_*,_std::allocator<inja::BlockStatementNode_*>_>
                *)&local_1a0.block_statement_stack);
  std::_Deque_base<inja::ForStatementNode_*,_std::allocator<inja::ForStatementNode_*>_>::
  ~_Deque_base((_Deque_base<inja::ForStatementNode_*,_std::allocator<inja::ForStatementNode_*>_> *)
               &local_1a0.for_statement_stack);
  std::_Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>::~_Deque_base
            ((_Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_> *)
             &local_1a0.if_statement_stack);
  return;
}

Assistant:

void parse_into_template(Template& tmpl, std::filesystem::path filename) {
    auto sub_parser = Parser(config, lexer.get_config(), template_storage, function_storage);
    sub_parser.parse_into(tmpl, filename.parent_path());
  }